

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::analysis::Function::IsSameImpl(Function *this,Type *that,IsSameCache *seen)

{
  pointer ppTVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  pointer ppTVar5;
  ulong uVar6;
  long lVar4;
  
  iVar3 = (*that->_vptr_Type[0x24])(that);
  lVar4 = CONCAT44(extraout_var,iVar3);
  if ((lVar4 != 0) &&
     (iVar3 = (*this->return_type_->_vptr_Type[2])
                        (this->return_type_,*(undefined8 *)(lVar4 + 0x28),seen), (char)iVar3 != '\0'
     )) {
    ppTVar5 = (this->param_types_).
              super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppTVar1 = (this->param_types_).
              super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((long)ppTVar1 - (long)ppTVar5 == *(long *)(lVar4 + 0x38) - *(long *)(lVar4 + 0x30)) {
      if (ppTVar1 != ppTVar5) {
        uVar6 = 0;
        do {
          iVar3 = (*ppTVar5[uVar6]->_vptr_Type[2])
                            (ppTVar5[uVar6],*(undefined8 *)(*(long *)(lVar4 + 0x30) + uVar6 * 8),
                             seen);
          if ((char)iVar3 == '\0') {
            return false;
          }
          uVar6 = uVar6 + 1;
          ppTVar5 = (this->param_types_).
                    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar6 < (ulong)((long)(this->param_types_).
                                       super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5 >>
                                3));
      }
      bVar2 = analysis::Type::HasSameDecorations(&this->super_Type,that);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool Function::IsSameImpl(const Type* that, IsSameCache* seen) const {
  const Function* ft = that->AsFunction();
  if (!ft) return false;
  if (!return_type_->IsSameImpl(ft->return_type_, seen)) return false;
  if (param_types_.size() != ft->param_types_.size()) return false;
  for (size_t i = 0; i < param_types_.size(); ++i) {
    if (!param_types_[i]->IsSameImpl(ft->param_types_[i], seen)) return false;
  }
  return HasSameDecorations(that);
}